

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int SUNMatZero_Sparse(SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  pvVar1 = A->content;
  for (lVar2 = 0; lVar2 < *(int *)((long)pvVar1 + 8); lVar2 = lVar2 + 1) {
    *(undefined8 *)(*(long *)((long)pvVar1 + 0x10) + lVar2 * 8) = 0;
    *(undefined4 *)(*(long *)((long)pvVar1 + 0x20) + lVar2 * 4) = 0;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x28);
  for (lVar3 = 0; lVar3 < *(int *)((long)pvVar1 + 0xc); lVar3 = lVar3 + 1) {
    *(undefined4 *)(lVar2 + lVar3 * 4) = 0;
  }
  *(undefined4 *)(lVar2 + (long)*(int *)((long)pvVar1 + 0xc) * 4) = 0;
  return 0;
}

Assistant:

int SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i=0; i<SM_NNZ_S(A); i++) {
    (SM_DATA_S(A))[i] = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i=0; i<SM_NP_S(A); i++)
    (SM_INDEXPTRS_S(A))[i] = 0;
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUNMAT_SUCCESS;
}